

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

optional<tinyusdz::Animatable<bool>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<bool>
          (optional<tinyusdz::Animatable<bool>_> *__return_storage_ptr__,PrimVar *var)

{
  vtable_type *pvVar1;
  pointer pSVar2;
  bool bVar3;
  undefined1 uVar4;
  optional<bool> oVar5;
  uint32_t uVar6;
  undefined6 extraout_var;
  undefined7 uVar7;
  TimeSamples *this;
  long lVar8;
  ulong uVar9;
  optional<bool> pv;
  Animatable<bool> dst;
  undefined1 local_78 [2];
  undefined1 local_76 [14];
  undefined1 local_68 [8];
  bool bStack_60;
  undefined7 uStack_5f;
  undefined1 local_58;
  undefined7 uStack_57;
  bool local_50;
  optional<tinyusdz::Animatable<bool>_> *local_48;
  storage_t<tinyusdz::Animatable<bool>_> *local_40;
  TimeSamples *local_38;
  
  local_76._6_3_ = 0;
  local_68 = (undefined1  [8])0x0;
  bStack_60 = false;
  uStack_5f = 0;
  local_58 = 0;
  uStack_57 = 0;
  local_50 = false;
  bVar3 = primvar::PrimVar::is_valid(var);
  if (bVar3) {
    if ((var->_blocked == false) &&
       (((pvVar1 = (var->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 0)) ||
        ((pvVar1 = (var->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 1)))))) {
      uVar7 = 0;
      uVar4 = '\0';
    }
    else {
      oVar5 = primvar::PrimVar::get_value<bool>((PrimVar *)local_78);
      uVar7 = (undefined7)(CONCAT62(extraout_var,oVar5) >> 8);
      uVar4 = local_78[0];
      if (local_78[0] == '\x01') {
        local_76._7_2_ = 1;
        local_76[6] = local_78[1];
      }
    }
    if ((var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (uVar4 == '\0') goto LAB_002551b7;
    }
    else {
      local_76._2_4_ = (undefined4)CONCAT71(uVar7,__return_storage_ptr__->has_value_);
      local_48 = __return_storage_ptr__;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this = &var->_ts;
        local_40 = &__return_storage_ptr__->contained;
        lVar8 = 0;
        uVar9 = 0;
        local_38 = this;
        do {
          if ((var->_ts)._dirty == true) {
            tinyusdz::value::TimeSamples::update(this);
          }
          pSVar2 = (this->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((&pSVar2->blocked)[lVar8] == true) {
            TypedTimeSamples<bool>::add_blocked_sample
                      ((TypedTimeSamples<bool> *)local_68,*(double *)((long)&pSVar2->t + lVar8));
          }
          else {
            tinyusdz::value::Value::get_value<bool>
                      ((Value *)local_76,(bool)((char)pSVar2 + (char)lVar8 + '\b'));
            uVar4 = local_76[0];
            local_78[0] = local_76[0];
            if (local_76[0] == '\x01') {
              local_78[1] = local_76[1];
              TypedTimeSamples<bool>::add_sample
                        ((TypedTimeSamples<bool> *)local_68,*(double *)((long)&pSVar2->t + lVar8),
                         (bool *)(local_78 + 1));
            }
            else {
              *(undefined8 *)((long)local_40 + 0x10) = 0;
              *(undefined8 *)((long)local_40 + 0x18) = 0;
              *(undefined8 *)local_40 = 0;
              *(undefined8 *)((long)local_40 + 8) = 0;
              *(undefined8 *)((long)local_40 + 0x20) = 0;
              local_76._2_4_ = 0;
            }
            this = local_38;
            if (uVar4 == '\0') {
              local_48->has_value_ = SUB41(local_76._2_4_,0);
              __return_storage_ptr__ = local_48;
              goto LAB_002551cd;
            }
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x28;
        } while (uVar9 < (ulong)(((long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x3333333333333333));
      }
      local_48->has_value_ = SUB41(local_76._2_4_,0);
      __return_storage_ptr__ = local_48;
    }
    __return_storage_ptr__->has_value_ = true;
    *(undefined2 *)&__return_storage_ptr__->contained = local_76._6_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->contained + 2) = local_76[8];
    *(undefined1 (*) [8])((long)&__return_storage_ptr__->contained + 8) = local_68;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) = CONCAT71(uStack_5f,bStack_60);
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) = CONCAT71(uStack_57,local_58);
    local_68 = (undefined1  [8])0x0;
    bStack_60 = false;
    uStack_5f = 0;
    local_58 = 0;
    uStack_57 = 0;
    *(bool *)((long)&__return_storage_ptr__->contained + 0x20) = local_50;
  }
  else {
LAB_002551b7:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
  }
LAB_002551cd:
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,CONCAT71(uStack_57,local_58) - (long)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}